

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O1

bool __thiscall
ruckig::Profile::
check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double aUp)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (this->t)._M_elems[1];
  if (0.0 <= dVar3) {
    (this->t_sum)._M_elems[0] = 0.0;
    (this->t_sum)._M_elems[1] = dVar3;
    (this->t_sum)._M_elems[2] = dVar3;
    (this->t_sum)._M_elems[3] = dVar3;
    (this->t_sum)._M_elems[4] = dVar3;
    (this->t_sum)._M_elems[5] = dVar3;
    (this->t_sum)._M_elems[6] = dVar3;
    if (dVar3 <= 1000000000000.0) {
      (this->j)._M_elems[6] = 0.0;
      (this->a)._M_elems[0] = 0.0;
      (this->j)._M_elems[4] = 0.0;
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[2] = 0.0;
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[0] = 0.0;
      (this->j)._M_elems[1] = 0.0;
      dVar4 = this->af;
      (this->a)._M_elems[1] = (double)(-(ulong)(0.0 < dVar3) & (ulong)aUp);
      (this->a)._M_elems[2] = 0.0;
      (this->a)._M_elems[3] = 0.0;
      (this->a)._M_elems[4] = 0.0;
      (this->a)._M_elems[5] = 0.0;
      (this->a)._M_elems[6] = 0.0;
      (this->a)._M_elems[7] = dVar4;
      dVar3 = (this->p)._M_elems[0];
      lVar2 = -0x38;
      dVar4 = (this->v)._M_elems[0];
      do {
        dVar1 = *(double *)((long)(this->t_sum)._M_elems + lVar2);
        dVar5 = *(double *)((long)(this->a)._M_elems + lVar2 + 0x38) * dVar1;
        dVar6 = dVar5 + dVar4;
        *(double *)((long)(this->p)._M_elems + lVar2) = dVar6;
        dVar3 = dVar3 + (dVar5 * 0.5 + dVar4) * dVar1;
        *(double *)((long)(this->brake).t._M_elems + lVar2 + -8) = dVar3;
        lVar2 = lVar2 + 8;
        dVar4 = dVar6;
      } while (lVar2 != 0);
      this->control_signs = UDDU;
      this->limits = NONE;
      this->direction = (uint)(aUp <= 0.0);
      return ABS((this->v)._M_elems[7] - this->vf) < 1e-08;
    }
  }
  return false;
}

Assistant:

bool check_for_second_order_velocity(double aUp) {
        // ReachedLimits::ACC0
        if (t[1] < 0.0) {
            return false;
        }

        t_sum = {0, t[1], t[1], t[1], t[1], t[1], t[1]};
        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        a = {0, (t[1] > 0) ? aUp : 0, 0, 0, 0, 0, 0, af};
        for (size_t i = 0; i < 7; ++i) {
            v[i+1] = v[i] + t[i] * a[i];
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (aUp > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(15) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(v.back() - vf) < v_precision;
    }